

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_18f8d8c::LevelTest::LevelTest(LevelTest *this)

{
  ParamType *pPVar1;
  
  testing::Test::Test((Test *)this);
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__TestWithParam_01045d40;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__CodecTestWith2Params_01045d80;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
           ::GetParam();
  (this->super_EncoderTest).codec_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>).
       super__Head_base<0UL,_const_libaom_test::CodecFactory_*,_false>._M_head_impl;
  (this->super_EncoderTest).abort_ = false;
  (this->super_EncoderTest).stats_.buffer_._M_dataplus._M_p =
       (pointer)&(this->super_EncoderTest).stats_.buffer_.field_2;
  (this->super_EncoderTest).stats_.buffer_._M_string_length = 0;
  (this->super_EncoderTest).stats_.buffer_.field_2._M_local_buf[0] = '\0';
  (this->super_EncoderTest).init_flags_ = 0;
  (this->super_EncoderTest).frame_flags_ = 0;
  (this->super_EncoderTest).mode_ = kRealTime;
  (this->super_EncoderTest).cfg_.g_threads = 1;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__LevelTest_01088be0;
  (this->super_CodecTestWith2Params<libaom_test::TestMode,_int>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__LevelTest_01088c28;
  (this->super_EncoderTest)._vptr_EncoderTest = (_func_int **)&PTR__LevelTest_01088c48;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
           ::GetParam();
  *(TestMode *)&(this->super_EncoderTest).field_0x3dc =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int>.
       super__Head_base<1UL,_libaom_test::TestMode,_false>._M_head_impl;
  pPVar1 = testing::
           WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>_>
           ::GetParam();
  this->cpu_used_ =
       (pPVar1->
       super__Tuple_impl<0UL,_const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int>).
       super__Tuple_impl<1UL,_libaom_test::TestMode,_int>.super__Tuple_impl<2UL,_int>.
       super__Head_base<2UL,_int,_false>._M_head_impl;
  this->target_level_ = 0x1f;
  return;
}

Assistant:

LevelTest()
      : EncoderTest(GET_PARAM(0)), encoding_mode_(GET_PARAM(1)),
        cpu_used_(GET_PARAM(2)), target_level_(31) {}